

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instruction.cpp
# Opt level: O3

void __thiscall
Hpipe::Instruction::optimize_conditions
          (Instruction *this,PtrPool<Hpipe::Instruction,_32> *inst_pool)

{
  pointer pTVar1;
  Transition *t;
  pointer pTVar2;
  
  if (this->op_id != cur_op_id) {
    this->op_id = cur_op_id;
    pTVar1 = (this->next).super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
             super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pTVar2 = (this->next).super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
                  super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>._M_impl.
                  super__Vector_impl_data._M_start; pTVar2 != pTVar1; pTVar2 = pTVar2 + 1) {
      (*pTVar2->inst->_vptr_Instruction[0xe])(pTVar2->inst,inst_pool);
    }
  }
  return;
}

Assistant:

void Instruction::optimize_conditions( PtrPool<Instruction> &inst_pool ) {
    if ( op_id == Instruction::cur_op_id )
        return;
    op_id = Instruction::cur_op_id;

    for( Transition &t : next )
        t.inst->optimize_conditions( inst_pool );
}